

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb-test.cpp
# Opt level: O1

uint32_t __thiscall cubeb_client::get_stream_output_latency(cubeb_client *this)

{
  uint in_EAX;
  int iVar1;
  uint32_t latency;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  iVar1 = cubeb_stream_get_latency(this->stream,(uint32_t *)((long)&uStack_8 + 4));
  if (iVar1 == 0) {
  }
  else {
    get_stream_output_latency();
    uStack_8._4_4_ = 0;
  }
  return uStack_8._4_4_;
}

Assistant:

uint32_t cubeb_client::get_stream_output_latency() const {
  uint32_t latency = 0;
  int rv = cubeb_stream_get_latency(stream, &latency);
  if (rv != CUBEB_OK) {
    fprintf(stderr, "Could not get the latency of the stream\n");
    return 0;
  }
  return latency;
}